

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_finalize(Context *ctx)

{
  push_output(ctx,&ctx->globals);
  output_blank_line(ctx);
  pop_output(ctx);
  if (ctx->have_relative_input_registers != 0) {
    fail(ctx,"Relative addressing of input registers not supported.");
  }
  push_output(ctx,&ctx->preflight);
  output_GLSL_uniform_array(ctx,REG_TYPE_CONST,ctx->uniform_float4_count);
  output_GLSL_uniform_array(ctx,REG_TYPE_CONSTINT,ctx->uniform_int4_count);
  output_GLSL_uniform_array(ctx,REG_TYPE_CONSTBOOL,ctx->uniform_bool_count);
  pop_output(ctx);
  return;
}

Assistant:

static void emit_GLSL_finalize(Context *ctx)
{
    // throw some blank lines around to make source more readable.
    push_output(ctx, &ctx->globals);
    output_blank_line(ctx);
    pop_output(ctx);

    // If we had a relative addressing of REG_TYPE_INPUT, we need to build
    //  an array for it at the start of main(). GLSL doesn't let you specify
    //  arrays of attributes.
    //vec4 blah_array[BIGGEST_ARRAY];
    if (ctx->have_relative_input_registers) // !!! FIXME
        fail(ctx, "Relative addressing of input registers not supported.");

    push_output(ctx, &ctx->preflight);
    output_GLSL_uniform_array(ctx, REG_TYPE_CONST, ctx->uniform_float4_count);
    output_GLSL_uniform_array(ctx, REG_TYPE_CONSTINT, ctx->uniform_int4_count);
    output_GLSL_uniform_array(ctx, REG_TYPE_CONSTBOOL, ctx->uniform_bool_count);
#ifdef MOJOSHADER_FLIP_RENDERTARGET
    if (shader_is_vertex(ctx))
        output_line(ctx, "uniform float vpFlip;");
#endif
    pop_output(ctx);
}